

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Receiver_PDU.cpp
# Opt level: O2

KBOOL __thiscall KDIS::PDU::Receiver_PDU::operator==(Receiver_PDU *this,Receiver_PDU *Value)

{
  KBOOL KVar1;
  
  KVar1 = Radio_Communications_Header::operator!=
                    (&this->super_Radio_Communications_Header,
                     &Value->super_Radio_Communications_Header);
  if ((!KVar1) &&
     (*(short *)&(this->super_Radio_Communications_Header).field_0x3a ==
      *(short *)&(Value->super_Radio_Communications_Header).field_0x3a)) {
    if (((float)this->m_f32RecPwr == (float)Value->m_f32RecPwr) &&
       ((!NAN((float)this->m_f32RecPwr) && !NAN((float)Value->m_f32RecPwr) &&
        (KVar1 = DATA_TYPE::EntityIdentifier::operator!=
                           (&this->m_TransmitterEntityID,&Value->m_TransmitterEntityID), !KVar1))))
    {
      return this->m_ui16TransmitterRadioID == Value->m_ui16TransmitterRadioID;
    }
  }
  return false;
}

Assistant:

KBOOL Receiver_PDU::operator == ( const Receiver_PDU & Value ) const
{
    if( Radio_Communications_Header::operator   !=( Value ) )                       return false;
    if( m_ui16ReceiverState                     != Value.m_ui16ReceiverState )      return false;
    if( m_f32RecPwr                             != Value.m_f32RecPwr )              return false;
    if( m_TransmitterEntityID                   != Value.m_TransmitterEntityID )    return false;
    if( m_ui16TransmitterRadioID                != Value.m_ui16TransmitterRadioID ) return false;
    return true;
}